

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::BaseTimeCoordinator::setAsParent(BaseTimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  long in_RDI;
  TimeDependencies *unaff_retaddr;
  GlobalFederateId in_stack_0000000c;
  DependencyInfo *dep;
  GlobalFederateId local_4;
  
  bVar1 = GlobalFederateId::operator==(&local_4,(GlobalFederateId)*(BaseType *)(in_RDI + 0x48));
  if ((!bVar1) &&
     (pDVar2 = TimeDependencies::getDependencyInfo(unaff_retaddr,in_stack_0000000c),
     pDVar2 != (DependencyInfo *)0x0)) {
    pDVar2->connection = PARENT;
    *(undefined1 *)(in_RDI + 0x50) = 0;
  }
  return;
}

Assistant:

void BaseTimeCoordinator::setAsParent(GlobalFederateId fedID)
{
    if (fedID == mSourceId) {
        return;
    }
    auto* dep = dependencies.getDependencyInfo(fedID);
    if (dep != nullptr) {
        dep->connection = ConnectionType::PARENT;
        noParent = false;
    }
}